

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O2

bool __thiscall cmParseCacheCoverage::ReadCMCovFile(cmParseCacheCoverage *this,char *file)

{
  cmCTest *pcVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  mapped_type *this_00;
  pointer piVar6;
  pointer piVar7;
  ulong uVar8;
  cmParseCacheCoverage *pcVar9;
  size_type i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  separateLine;
  _Base_ptr local_438 [4];
  string routine;
  string line;
  string filepath;
  ostringstream cmCTestLog_msg;
  ifstream in;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&in,file,_S_in);
  if ((abStack_218[*(long *)(_in + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Can not open : ");
    poVar5 = std::operator<<(poVar5,file);
    std::operator<<(poVar5,"\n");
    pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0x73,line._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar3 = false;
LAB_002c6b57:
    std::ifstream::~ifstream(&in);
    return bVar3;
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  separateLine.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  separateLine.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  separateLine.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = cmsys::SystemTools::GetLineFromStream((istream *)&in,&line,(bool *)0x0,-1);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Empty file : ");
    poVar5 = std::operator<<(poVar5,file);
    poVar5 = std::operator<<(poVar5,"  referenced in this line of cmcov data:\n[");
    poVar5 = std::operator<<(poVar5,(string *)&line);
    std::operator<<(poVar5,"]\n");
    pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0x7d,routine._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&routine);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar3 = false;
LAB_002c6b43:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&separateLine);
    std::__cxx11::string::~string((string *)&line);
    goto LAB_002c6b57;
  }
  pcVar9 = (cmParseCacheCoverage *)&separateLine;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&separateLine);
  SplitString(pcVar9,&separateLine,&line);
  if ((long)separateLine.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)separateLine.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x80) {
    bVar3 = std::operator!=(separateLine.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"Routine");
    if (!bVar3) {
      bVar3 = std::operator!=(separateLine.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1,"Line");
      if (!bVar3) {
        bVar3 = std::operator!=(separateLine.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2,"RtnLine");
        if (!bVar3) {
          bVar3 = std::operator!=(separateLine.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 3,"Code");
          if (!bVar3) goto LAB_002c659e;
        }
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Bad first line of cmcov file : ");
  poVar5 = std::operator<<(poVar5,file);
  poVar5 = std::operator<<(poVar5,"  line:\n[");
  poVar5 = std::operator<<(poVar5,(string *)&line);
  std::operator<<(poVar5,"]\n");
  pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
               ,0x89,routine._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&routine);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
LAB_002c659e:
  routine._M_dataplus._M_p = (pointer)&routine.field_2;
  routine._M_string_length = 0;
  routine.field_2._M_local_buf[0] = '\0';
  filepath._M_dataplus._M_p = (pointer)&filepath.field_2;
  filepath._M_string_length = 0;
  filepath.field_2._M_local_buf[0] = '\0';
LAB_002c65e0:
  bVar3 = cmsys::SystemTools::GetLineFromStream((istream *)&in,&line,(bool *)0x0,-1);
  if (bVar3) {
    pcVar9 = (cmParseCacheCoverage *)&separateLine;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&separateLine);
    SplitString(pcVar9,&separateLine,&line);
    if (0x7f < (ulong)((long)separateLine.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)separateLine.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      if (routine._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&routine);
        bVar3 = cmParseMumpsCoverage::FindMumpsFile
                          (&this->super_cmParseMumpsCoverage,&routine,&filepath);
        if (bVar3) goto LAB_002c669b;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,
                                 "Could not find mumps file for routine: ");
        poVar5 = std::operator<<(poVar5,(string *)&routine);
        std::operator<<(poVar5,"\n");
        pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                     ,0xae,(char *)local_438[0],false);
        std::__cxx11::string::~string((string *)local_438);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
LAB_002c6850:
        std::__cxx11::string::assign((char *)&filepath);
      }
      else {
        std::__cxx11::string::substr
                  ((ulong)&cmCTestLog_msg,
                   (ulong)separateLine.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&cmCTestLog_msg,"Totals");
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        if (bVar3) {
          std::__cxx11::string::assign((char *)&routine);
          goto LAB_002c6850;
        }
LAB_002c669b:
        if (filepath._M_string_length != 0) {
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&((this->super_cmParseMumpsCoverage).Coverage)->TotalCoverage,
                                 &filepath);
          pbVar2 = separateLine.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar4 = atoi(separateLine.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
          uVar8 = (ulong)(iVar4 + -1);
          iVar4 = atoi(pbVar2[2]._M_dataplus._M_p);
          piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar7 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if ((ulong)((long)piVar7 - (long)piVar6 >> 2) < uVar8) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,
                                     "Parse error line is greater than number of lines in file: ");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            poVar5 = std::operator<<(poVar5," ");
            poVar5 = std::operator<<(poVar5,(string *)&filepath);
            std::operator<<(poVar5,"\n");
            pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                         ,0xcf,(char *)local_438[0],false);
            std::__cxx11::string::~string((string *)local_438);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          }
          else {
            while ((ulong)((long)piVar7 - (long)piVar6 >> 2) <= uVar8) {
              _cmCTestLog_msg = 0xffffffff;
              std::vector<int,_std::allocator<int>_>::emplace_back<int>
                        (this_00,(int *)&cmCTestLog_msg);
              piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              piVar7 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
            }
            if ((piVar6[uVar8] == -1) && (0 < iVar4)) {
              piVar6[uVar8] = iVar4;
            }
            else {
              piVar6[uVar8] = piVar6[uVar8] + iVar4;
            }
          }
        }
      }
      goto LAB_002c65e0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,
                             "Bad line of cmcov file expected at least 4 found: ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,file);
    poVar5 = std::operator<<(poVar5,"  line:\n[");
    poVar5 = std::operator<<(poVar5,(string *)&line);
    std::operator<<(poVar5,"]\n");
    pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0x9b,(char *)local_438[0],false);
    std::__cxx11::string::~string((string *)local_438);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    for (uVar8 = 0;
        uVar8 < (ulong)((long)separateLine.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)separateLine.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar8 = uVar8 + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"");
      poVar5 = std::operator<<(poVar5,(string *)
                                      (separateLine.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      std::operator<<(poVar5," ");
      pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                   ,0x9f,(char *)local_438[0],false);
      std::__cxx11::string::~string((string *)local_438);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,"\n");
    pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0xa1,(char *)local_438[0],false);
    std::__cxx11::string::~string((string *)local_438);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  bVar3 = !bVar3;
  std::__cxx11::string::~string((string *)&filepath);
  std::__cxx11::string::~string((string *)&routine);
  goto LAB_002c6b43;
}

Assistant:

bool cmParseCacheCoverage::ReadCMCovFile(const char* file)
{
  cmsys::ifstream in(file);
  if(!in)
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Can not open : "
               << file << "\n");
    return false;
    }
  std::string line;
  std::vector<std::string> separateLine;
  if(!cmSystemTools::GetLineFromStream(in, line))
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Empty file : "
               << file << "  referenced in this line of cmcov data:\n"
               "[" << line << "]\n");
    return false;
    }
  separateLine.clear();
  this->SplitString(separateLine, line);
  if(separateLine.size() !=4 || separateLine[0] != "Routine"
     || separateLine[1] != "Line" || separateLine[2] != "RtnLine"
     || separateLine[3] != "Code")
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Bad first line of cmcov file : "
               << file << "  line:\n"
               "[" << line << "]\n");
    }
  std::string routine;
  std::string filepath;
  while(cmSystemTools::GetLineFromStream(in, line))
    {
    // clear out line argument vector
    separateLine.clear();
    // parse the comma separated line
    this->SplitString(separateLine, line);
    // might have more because code could have a quoted , in it
    // but we only care about the first 3 args anyway
    if(separateLine.size() < 4)
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Bad line of cmcov file expected at least 4 found: "
                 << separateLine.size() << " "
                 << file << "  line:\n"
                 "[" << line << "]\n");
      for(std::string::size_type i = 0; i < separateLine.size(); ++i)
        {
        cmCTestLog(this->CTest, ERROR_MESSAGE,""
                   << separateLine[1] << " ");
        }
      cmCTestLog(this->CTest, ERROR_MESSAGE, "\n");
      return false;
      }
    // if we do not have a routine yet, then it should be
    // the first argument in the vector
    if(routine.empty())
      {
      routine = separateLine[0];
      // Find the full path to the file
      if(!this->FindMumpsFile(routine, filepath))
        {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Could not find mumps file for routine: "
                   << routine << "\n");
        filepath = "";
        continue; // move to next line
        }
      }
    // if we have a routine name, check for end of routine
    else
      {
      // Totals in arg 0 marks the end of a routine
      if(separateLine[0].substr(0, 6) == "Totals")
        {
        routine = ""; // at the end of this routine
        filepath = "";
        continue; // move to next line
        }
      }
    // if the file path was not found for the routine
    // move to next line. We should have already warned
    // after the call to FindMumpsFile that we did not find
    // it, so don't report again to cut down on output
    if(filepath.empty())
      {
      continue;
      }
    // now we are ready to set the coverage from the line of data
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector&
      coverageVector = this->Coverage.TotalCoverage[filepath];
    std::string::size_type linenumber = atoi(separateLine[1].c_str()) -1;
    int count = atoi(separateLine[2].c_str());
    if(linenumber > coverageVector.size())
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Parse error line is greater than number of lines in file: "
                 << linenumber << " " << filepath << "\n");
      continue; // skip setting count to avoid crash
      }
    // now add to count for linenumber
    // for some reason the cache coverage adds extra lines to the
    // end of the file in some cases. Since they do not exist, we will
    // mark them as non executable
    while(linenumber >= coverageVector.size())
      {
      coverageVector.push_back(-1);
      }
    // Accounts for lines that were previously marked
    // as non-executable code (-1). if the parser comes back with
    // a non-zero count, increase the count by 1 to push the line
    // into the executable code set in addition to the count found.
    if(coverageVector[linenumber] == -1 &&
        count > 0)
      {
        coverageVector[linenumber] += count+1;
      }
    else
      {
        coverageVector[linenumber] += count;
      }
    }
  return true;
}